

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExpressionConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionConstraintSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,Token *args_2)

{
  Token soft;
  Token semi;
  ExpressionConstraintSyntax *this_00;
  
  this_00 = (ExpressionConstraintSyntax *)allocate(this,0x38,8);
  soft.kind = args->kind;
  soft._2_1_ = args->field_0x2;
  soft.numFlags.raw = (args->numFlags).raw;
  soft.rawLen = args->rawLen;
  soft.info = args->info;
  semi.kind = args_2->kind;
  semi._2_1_ = args_2->field_0x2;
  semi.numFlags.raw = (args_2->numFlags).raw;
  semi.rawLen = args_2->rawLen;
  semi.info = args_2->info;
  slang::syntax::ExpressionConstraintSyntax::ExpressionConstraintSyntax(this_00,soft,args_1,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }